

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

mat4 * dja::mat4::homogeneous::rotation(mat4 *__return_storage_ptr__,quaternion *q)

{
  mat3 local_34;
  
  mat3::rotation(q);
  from_mat3(&local_34);
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4::homogeneous::rotation(const quaternion& q)
{
    return mat4::homogeneous::from_mat3(mat3::rotation(q));
}